

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int64_t JS_FlattenIntoArray(JSContext *ctx,JSValue target,JSValue source,int64_t sourceLen,
                           int64_t targetIndex,int depth,JSValue mapperFunction,JSValue thisArg)

{
  JSValue new_target;
  JSValue thisArg_00;
  undefined1 auVar1 [16];
  int iVar2;
  JSValueUnion JVar3;
  uintptr_t sp;
  int64_t iVar4;
  JSValueUnion idx;
  bool bVar5;
  JSValue v;
  JSValue v_00;
  JSValue target_00;
  JSValue this_obj;
  JSValue JVar6;
  JSValue prop;
  undefined4 uStack_ec;
  uint uStack_dc;
  int64_t local_d0;
  int64_t elementLen;
  JSValueUnion local_c0;
  int *local_b8;
  int64_t local_b0;
  JSValueUnion local_a8;
  int64_t iStack_a0;
  JSValueUnion local_98;
  ulong local_90;
  JSValueUnion local_88;
  int64_t local_80;
  int local_6c;
  JSValueUnion local_68;
  undefined8 uStack_60;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValueUnion local_40;
  ulong local_38;
  
  iVar4 = source.tag;
  local_40 = source.u;
  elementLen = target.tag;
  local_c0 = target.u;
  if (&stack0xfffffffffffffff8 < (undefined1 *)ctx->rt->stack_limit) {
    JS_ThrowInternalError(ctx,"stack overflow");
    targetIndex = -1;
  }
  else if (0 < sourceLen) {
    local_38 = targetIndex;
    local_6c = depth + -1;
    idx.float64 = 0.0;
    local_b8 = (int *)sourceLen;
    local_b0 = iVar4;
    while( true ) {
      JVar6.tag = iVar4;
      JVar6.u.float64 = local_40.float64;
      iVar2 = JS_TryGetPropertyInt64(ctx,JVar6,(int64_t)idx,(JSValue *)&local_58);
      targetIndex = -1;
      if (iVar2 < 0) break;
      if (iVar2 != 0) {
        if ((int)mapperFunction.tag != 3) {
          local_90 = (ulong)idx.ptr >> 0x1f;
          local_98.float64 = (double)idx.float64;
          if (local_90 == 0) {
            local_98 = idx;
          }
          local_a8 = local_58;
          iStack_a0 = iStack_50;
          if (local_90 != 0) {
            local_90 = 7;
          }
          local_88.float64 = local_40.float64;
          local_68.float64 = local_68.float64 & 0xffffffff00000000;
          uStack_60 = 3;
          new_target.tag._0_4_ = 3;
          new_target.u.float64 = local_68.float64;
          new_target.tag._4_4_ = 0;
          local_80 = iVar4;
          JVar6 = JS_CallInternal(ctx,mapperFunction,thisArg,new_target,3,(JSValue *)&local_a8,2);
          local_68.float64 = local_a8.float64;
          _local_58 = JVar6;
          if ((0xfffffff4 < (uint)iStack_a0) &&
             (iVar2 = *local_a8.ptr, *(int *)local_a8.ptr = iVar2 + -1, iVar2 < 2)) {
            v.tag = iStack_a0;
            v.u.ptr = local_a8.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
          local_68.float64 = local_98.float64;
          if ((0xfffffff4 < (uint)local_90) &&
             (iVar2 = *local_98.ptr, *(int *)local_98.ptr = iVar2 + -1, iVar2 < 2)) {
            v_00.tag = local_90;
            v_00.u.float64 = local_98.float64;
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          if ((int)JVar6.tag == 6) {
            return -1;
          }
        }
        JVar6 = _local_58;
        if (0 < depth) {
          JVar3 = local_58;
          iVar2 = JS_IsArray(ctx,_local_58);
          if (iVar2 < 0) goto LAB_001684af;
          if (iVar2 != 0) {
            iVar2 = js_get_length64(ctx,&local_d0,JVar6);
            if ((iVar2 < 0) ||
               (auVar1._4_4_ = 3, auVar1._0_4_ = uStack_ec, auVar1._8_8_ = 0, thisArg_00.tag = 3,
               thisArg_00.u.ptr = (void *)((ulong)uStack_dc << 0x20), target_00.tag = elementLen,
               target_00.u.ptr = local_c0.ptr,
               local_38 = JS_FlattenIntoArray(ctx,target_00,JVar6,local_d0,local_38,local_6c,
                                              (JSValue)(auVar1 << 0x20),thisArg_00),
               (long)local_38 < 0)) goto LAB_001684af;
            local_a8.float64 = JVar3.float64;
            sourceLen = (int64_t)local_b8;
            iVar4 = local_b0;
            if ((0xfffffff4 < (uint)JVar6.tag) &&
               (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar6);
              sourceLen = (int64_t)local_b8;
              iVar4 = local_b0;
            }
            goto LAB_00168479;
          }
        }
        if (0x1ffffffffffffe < (long)local_38) {
          JS_ThrowTypeError(ctx,"Array too long");
LAB_001684af:
          local_a8.float64 = local_58.float64;
          if (local_58._8_4_ < 0xfffffff5) {
            return -1;
          }
          iVar2 = *local_58.ptr;
          *(int *)local_58.ptr = iVar2 + -1;
          if (1 < iVar2) {
            return -1;
          }
          __JS_FreeValueRT(ctx->rt,_local_58);
          return -1;
        }
        bVar5 = (long)(int)local_38 == local_38;
        JVar3.float64 = (double)(long)local_38;
        if (bVar5) {
          JVar3.ptr = (void *)(local_38 & 0xffffffff);
        }
        local_a8 = local_58;
        iStack_a0 = iStack_50;
        iVar4 = 7;
        if (bVar5) {
          iVar4 = 0;
        }
        this_obj.tag = elementLen;
        this_obj.u.ptr = local_c0.ptr;
        prop.tag = iVar4;
        prop.u.float64 = JVar3.float64;
        iVar2 = JS_DefinePropertyValueValue(ctx,this_obj,prop,_local_58,0x4007);
        if (iVar2 < 0) {
          return -1;
        }
        local_38 = local_38 + 1;
        sourceLen = (int64_t)local_b8;
        iVar4 = local_b0;
      }
LAB_00168479:
      idx.float64 = idx.float64 + 1;
      if ((void *)sourceLen == idx.ptr) {
        return local_38;
      }
    }
  }
  return targetIndex;
}

Assistant:

static int64_t JS_FlattenIntoArray(JSContext *ctx, JSValueConst target,
                                   JSValueConst source, int64_t sourceLen,
                                   int64_t targetIndex, int depth,
                                   JSValueConst mapperFunction,
                                   JSValueConst thisArg)
{
    JSValue element;
    int64_t sourceIndex, elementLen;
    int present, is_array;

    if (js_check_stack_overflow(ctx->rt, 0)) {
        JS_ThrowStackOverflow(ctx);
        return -1;
    }

    for (sourceIndex = 0; sourceIndex < sourceLen; sourceIndex++) {
        present = JS_TryGetPropertyInt64(ctx, source, sourceIndex, &element);
        if (present < 0)
            return -1;
        if (!present)
            continue;
        if (!JS_IsUndefined(mapperFunction)) {
            JSValueConst args[3] = { element, JS_NewInt64(ctx, sourceIndex), source };
            element = JS_Call(ctx, mapperFunction, thisArg, 3, args);
            JS_FreeValue(ctx, (JSValue)args[0]);
            JS_FreeValue(ctx, (JSValue)args[1]);
            if (JS_IsException(element))
                return -1;
        }
        if (depth > 0) {
            is_array = JS_IsArray(ctx, element);
            if (is_array < 0)
                goto fail;
            if (is_array) {
                if (js_get_length64(ctx, &elementLen, element) < 0)
                    goto fail;
                targetIndex = JS_FlattenIntoArray(ctx, target, element,
                                                  elementLen, targetIndex,
                                                  depth - 1,
                                                  JS_UNDEFINED, JS_UNDEFINED);
                if (targetIndex < 0)
                    goto fail;
                JS_FreeValue(ctx, element);
                continue;
            }
        }
        if (targetIndex >= MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array too long");
            goto fail;
        }
        if (JS_DefinePropertyValueInt64(ctx, target, targetIndex, element,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            return -1;
        targetIndex++;
    }
    return targetIndex;

fail:
    JS_FreeValue(ctx, element);
    return -1;
}